

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<unsigned_long> * testing::A<unsigned_long>(void)

{
  MatcherInterface<unsigned_long> *pMVar1;
  Matcher<unsigned_long> *in_RDI;
  
  pMVar1 = (MatcherInterface<unsigned_long> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_00192818;
  (in_RDI->super_MatcherBase<unsigned_long>).impl_.value_ = pMVar1;
  (in_RDI->super_MatcherBase<unsigned_long>).impl_.link_.next_ =
       &(in_RDI->super_MatcherBase<unsigned_long>).impl_.link_;
  (in_RDI->super_MatcherBase<unsigned_long>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001919b0;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }